

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

void __thiscall ON_Triangle::Flip(ON_Triangle *this,uchar edge)

{
  uchar edge_local;
  ON_Triangle *this_local;
  
  if ((uint)edge % 3 == 0) {
    std::swap<ON_3dPoint>(this->m_V + 1,this->m_V + 2);
  }
  else if ((uint)edge % 3 == 1) {
    std::swap<ON_3dPoint>(this->m_V + 2,this->m_V);
  }
  else {
    std::swap<ON_3dPoint>(this->m_V,this->m_V + 1);
  }
  return;
}

Assistant:

void ON_Triangle::Flip(unsigned char edge)
{
  switch (edge % 3)
  {
  case 0:
    std::swap(m_V[1], m_V[2]);
    break;
  case 1:
    std::swap(m_V[2], m_V[0]);
    break;
  default: //2
    std::swap(m_V[0], m_V[1]);
    break;
  }
}